

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O2

void __thiscall
Clasp::BasicProgramAdapter::minimize(BasicProgramAdapter *this,Weight_t prio,WeightLitSpan *lits)

{
  WeightLitVec *min;
  int iVar1;
  pair<Clasp::Literal,_int> in_RAX;
  WeightLit_t *pWVar2;
  long lVar3;
  pair<Clasp::Literal,_int> local_38;
  
  if (prio == 0) {
    min = &this->constraint_;
    (this->constraint_).ebo_.size = 0;
    pWVar2 = lits->first;
    local_38 = in_RAX;
    for (lVar3 = lits->size << 3; lVar3 != 0; lVar3 = lVar3 + -8) {
      iVar1 = pWVar2->lit;
      local_38.first.rep_ = iVar1 * -4 + 2;
      if (-1 < iVar1) {
        local_38.first.rep_ = iVar1 * 4;
      }
      local_38.second = pWVar2->weight;
      bk_lib::
      pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
      push_back(min,&local_38);
      pWVar2 = pWVar2 + 1;
    }
    iVar1 = (*this->prg_->_vptr_ProgramBuilder[8])();
    if (iVar1 == 0) {
      SatBuilder::addObjective((SatBuilder *)this->prg_,min);
    }
    else {
      PBBuilder::addObjective((PBBuilder *)this->prg_,min);
    }
    return;
  }
  Potassco::fail(-2,
                 "virtual void Clasp::BasicProgramAdapter::minimize(Potassco::Weight_t, const Potassco::WeightLitSpan &)"
                 ,0x18c,"prio == 0","unsupported rule type",0);
}

Assistant:

void BasicProgramAdapter::minimize(Potassco::Weight_t prio, const Potassco::WeightLitSpan& lits) {
	POTASSCO_REQUIRE(prio == 0, "unsupported rule type");
	using namespace Potassco;
	constraint_.clear();
	for (WeightLitSpan::iterator it = begin(lits), end = Potassco::end(lits); it != end; ++it) { constraint_.push_back(WeightLiteral(toLit(it->lit), it->weight)); }
	if (prg_->type() == Problem_t::Sat) {
		static_cast<SatBuilder&>(*prg_).addObjective(constraint_);
	}
	else {
		static_cast<PBBuilder&>(*prg_).addObjective(constraint_);
	}
}